

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_0>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_0> *this)

{
  code *pcVar1;
  C_A_T_C_H_T_E_S_T_0 obj;
  communicator local_28;
  
  local_28.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  local_28.rank_ = 0;
  local_28.size_ = 1;
  local_28.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(local_28.comm_.data,&local_28.size_);
  pcVar1 = (code *)this->m_testAsMethod;
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)((long)&local_28.comm_.data + *(long *)&this->field_0x10)
                                 + -1);
  }
  (*pcVar1)();
  diy::mpi::communicator::~communicator(&local_28);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }